

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O2

int __thiscall
roaring::Roaring64Map::select
          (Roaring64Map *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  _Rb_tree_color _Var1;
  int iVar2;
  _Rb_tree_node_base *in_RAX;
  uint64_t uVar3;
  runtime_error *this_00;
  _Rb_tree_header *p_Var4;
  undefined4 in_register_00000034;
  ulong uVar5;
  _Base_ptr p_Var6;
  uint32_t low_bytes;
  _Rb_tree_node_base *local_38;
  
  p_Var4 = &(this->roarings)._M_t._M_impl.super__Rb_tree_header;
  uVar5 = CONCAT44(in_register_00000034,__nfds);
  p_Var6 = (this->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_38 = (_Rb_tree_node_base *)__readfds;
  do {
    if ((_Rb_tree_header *)p_Var6 == p_Var4) {
LAB_0010dde1:
      return (int)CONCAT71((int7)((ulong)in_RAX >> 8),(_Rb_tree_header *)p_Var6 != p_Var4);
    }
    _Var1 = p_Var6[1]._M_color;
    uVar3 = Roaring::cardinality((Roaring *)&p_Var6[1]._M_parent);
    if (uVar5 < uVar3) {
      iVar2 = Roaring::select((Roaring *)&p_Var6[1]._M_parent,(int)uVar5,(fd_set *)&low_bytes,
                              __writefds,__exceptfds,__timeout);
      if ((char)iVar2 == '\0') {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this_00,
                   "Logic error: bitmap.select() returned false despite rank < cardinality()");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      *(ulong *)local_38 = CONCAT44(_Var1,low_bytes);
      in_RAX = local_38;
      goto LAB_0010dde1;
    }
    in_RAX = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    uVar5 = uVar5 - uVar3;
    p_Var6 = in_RAX;
  } while( true );
}

Assistant:

bool select(uint64_t rank, uint64_t *element) const {
        for (const auto &map_entry : roarings) {
            auto key = map_entry.first;
            const auto &bitmap = map_entry.second;

            uint64_t sub_cardinality = bitmap.cardinality();
            if (rank < sub_cardinality) {
                uint32_t low_bytes;
                // Casting rank to uint32_t is safe because
                // rank < sub_cardinality and sub_cardinality <= 2^32.
                if (!bitmap.select((uint32_t)rank, &low_bytes)) {
                    ROARING_TERMINATE(
                        "Logic error: bitmap.select() "
                        "returned false despite rank < cardinality()");
                }
                *element = uniteBytes(key, low_bytes);
                return true;
            }
            rank -= sub_cardinality;
        }
        return false;
    }